

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void simd::RgbToBgr(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                   uint32_t startYOut,uint32_t width,uint32_t height,SIMDType simdType)

{
  uint32_t startXIn_00;
  uint32_t uVar1;
  uint32_t rowSizeOut_00;
  uint simdWidth_00;
  uchar *puVar2;
  uchar *puVar3;
  ImageTemplate<unsigned_char> *in_RCX;
  uint32_t in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  int in_R9D;
  uint32_t unaff_retaddr;
  uint32_t in_stack_00000008;
  SIMDType in_stack_00000010;
  SIMDType in_stack_00000018;
  uint32_t nonSimdWidth;
  uint32_t totalSimdWidth;
  uint32_t simdWidth;
  uint32_t rgbSimdSize;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint8_t colorCount;
  uint32_t simdSize;
  undefined4 in_stack_ffffffffffffff0c;
  SIMDType SVar4;
  undefined4 in_stack_ffffffffffffff14;
  uint32_t in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff40;
  uint32_t local_b8;
  uint32_t local_b4;
  uint32_t in_stack_ffffffffffffff50;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff58;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff60;
  uint32_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint8_t in_stack_ffffffffffffffb7;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  uint8_t *in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  Image *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  startXIn_00 = getSimdSize(in_stack_00000018);
  if (in_stack_00000018 == neon_function) {
    startXIn_00 = 8;
  }
  uVar1 = CONCAT13(3,(int3)in_stack_ffffffffffffffd8);
  if ((in_stack_00000018 == cpu_function) || (in_stack_00000008 * 3 < startXIn_00)) {
    if (in_stack_00000018 == avx_function) {
      RgbToBgr((Image *)CONCAT44(in_ESI,in_EDX),(uint32_t)((ulong)in_RCX >> 0x20),(uint32_t)in_RCX,
               (Image *)CONCAT44(in_R8D,in_R9D),startXIn_00,uVar1,unaff_retaddr,in_stack_00000008,
               in_stack_00000010);
    }
    else {
      Image_Function::RgbToBgr
                ((Image *)CONCAT44(in_R8D,in_R9D),startXIn_00,uVar1,in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_EDX,(uint32_t)in_RDI);
    }
  }
  else {
    uVar1 = in_stack_00000008;
    SVar4 = in_stack_00000010;
    Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
              (in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20),
               (uint32_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               (uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               (uint32_t)in_stack_ffffffffffffff28,in_stack_ffffffffffffff50,
               (uint32_t)in_stack_ffffffffffffff58);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff14,SVar4),
               (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff0c,uVar1));
    Image_Function::
    VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
              ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff14,SVar4),
               (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff0c,uVar1));
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x15e84b);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff14,SVar4),
               (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff0c,uVar1));
    Image_Function::
    OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
              ((uint32_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x15e8ad);
    uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
    rowSizeOut_00 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
    puVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    puVar2 = puVar2 + (ulong)(uint)(in_ESI * 3) + (ulong)(in_EDX * uVar1);
    puVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
    simdWidth_00 = (startXIn_00 / 3) * 3;
    local_b4 = ((in_stack_00000008 * 3) / simdWidth_00) * simdWidth_00;
    local_b8 = in_stack_00000008 * 3 - local_b4;
    if (local_b8 < startXIn_00 % 3) {
      local_b4 = local_b4 + (startXIn_00 / 3) * -3;
      local_b8 = simdWidth_00 + local_b8;
    }
    if (in_stack_00000018 == avx_function) {
      avx::RgbToBgr((uint8_t *)in_stack_ffffffffffffffd0,
                    (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                    in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                    in_stack_ffffffffffffffb7,local_b4,local_b8,in_stack_ffffffffffffff20);
    }
    else if (in_stack_00000018 == sse_function) {
      sse::RgbToBgr(puVar3 + (ulong)(uint)(in_R8D * 3) + (ulong)(in_R9D * rowSizeOut_00),puVar2,
                    puVar3 + (ulong)(uint)(in_R8D * 3) + (ulong)(in_R9D * rowSizeOut_00) +
                    in_stack_00000010 * rowSizeOut_00,rowSizeOut_00,uVar1,'\x03',simdWidth_00,
                    local_b4,local_b8);
    }
  }
  return;
}

Assistant:

void RgbToBgr( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                   uint32_t width, uint32_t height, SIMDType simdType )
    {
        uint32_t simdSize = getSimdSize( simdType );

        if( simdType == neon_function ) // for neon, because the algorithm used work with packet of 64 bit
            simdSize = 8u;

        const uint8_t colorCount = RGB;

        if( (simdType == cpu_function) || ((width * colorCount) < simdSize) ) {
            AVX_CODE( RgbToBgr( in, startXIn, startYIn, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::RgbToBgr( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyRGBImage     ( in, out );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t rgbSimdSize = (simdSize / colorCount) * colorCount;
        const uint32_t simdWidth = width / rgbSimdSize;
        uint32_t totalSimdWidth = simdWidth * rgbSimdSize;
        uint32_t nonSimdWidth = width - totalSimdWidth;

        // to prevent unallowed access to memory
        if( nonSimdWidth < (simdSize % colorCount) ) {
            totalSimdWidth -= rgbSimdSize;
            nonSimdWidth += rgbSimdSize;
        }

        AVX_CODE( avx::RgbToBgr( outY, inY, outYEnd, rowSizeOut, rowSizeIn, colorCount, rgbSimdSize, totalSimdWidth, nonSimdWidth ); )
        SSSE3_CODE( sse::RgbToBgr( outY, inY, outYEnd, rowSizeOut, rowSizeIn, colorCount, rgbSimdSize, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::RgbToBgr( outY, inY, outYEnd, rowSizeOut, rowSizeIn, colorCount, rgbSimdSize, totalSimdWidth, nonSimdWidth ); )
    }